

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  
  iVar1 = edge_case_tests();
  iVar2 = error_case_tests();
  iVar3 = union_vector_tests();
  iVar4 = fixed_array_tests();
  iVar5 = base64_tests();
  iVar6 = mixed_type_union_tests();
  iVar7 = test_json(&Monster,"{ \"name\": \"Monster\", }","{\"name\":\"Monster\"}",0,0,0,0x256);
  iVar8 = test_json(&Monster,"{\"color\": \"Red\",  \"name\": \"Monster\", }",
                    "{\"name\":\"Monster\",\"color\":\"Red\"}",0,0,0,0x259);
  iVar9 = test_json(&Monster,"{ \"name\": \"Monster\", \"color\": \"Green\" }",
                    "{\"name\":\"Monster\",\"color\":\"Green\"}",0,0,0,0x25c);
  iVar10 = test_json(&Monster,"{ \"name\": \"Monster\", \"color\": \"Green Red Blue\" }",
                     "{\"name\":\"Monster\",\"color\":\"Red Green Blue\"}",0,0,0,0x25f);
  iVar11 = test_json(&Monster,"{ \"name\": \"Monster\", \"color\": \"   Green  Red   Blue   \" }",
                     "{\"name\":\"Monster\",\"color\":\"Red Green Blue\"}",0,0,0,0x262);
  iVar12 = test_json(&Monster,"{ \"name\": \"Monster\", \"color\": \"Red\" }",
                     "{\"name\":\"Monster\",\"color\":\"Red\"}",0,0,0,0x265);
  iVar13 = test_json(&Monster,"{ \"name\": \"Monster\", \"color\"  :\"Green\" }",
                     "{\"name\":\"Monster\",\"color\":\"Green\"}",0,0,0,0x268);
  iVar14 = test_json(&Monster,"{ \"name\": \"Monster\", \"color\": \"Blue\" }",
                     "{\"name\":\"Monster\"}",0,0,0,0x26c);
  iVar15 = test_json(&Monster,"{ \"name\": \"Monster\", \"color\": 8}","{\"name\":\"Monster\"}",0,0,
                     0,0x270);
  iVar16 = test_json(&Monster,"{ \"name\": \"Monster\", \"color\": 1}",
                     "{\"name\":\"Monster\",\"color\":\"Red\"}",0,0,0,0x2a2);
  iVar17 = test_json(&Monster,"{ \"name\": \"Monster\", \"color\": 2}",
                     "{\"name\":\"Monster\",\"color\":\"Green\"}",0,0,0,0x2a5);
  iVar18 = test_json(&Monster,"{ \"name\": \"Monster\", \"color\": 9}",
                     "{\"name\":\"Monster\",\"color\":\"Red Blue\"}",0,0,0,0x2a8);
  iVar19 = test_json(&Monster,"{ \"name\": \"Monster\", \"color\": 11}",
                     "{\"name\":\"Monster\",\"color\":\"Red Green Blue\"}",0,0,0,0x2ab);
  iVar20 = test_json(&Monster,"{ \"name\": \"Monster\", \"color\": 12}",
                     "{\"name\":\"Monster\",\"color\":12}",0,0,0,0x2ae);
  iVar21 = test_json(&Monster,"{ \"name\": \"Monster\", \"color\": 15}",
                     "{\"name\":\"Monster\",\"color\":15}",0,0,0,0x2b1);
  iVar22 = test_json(&Monster,"{ \"name\": \"Monster\", \"color\": 0}",
                     "{\"name\":\"Monster\",\"color\":0}",0,0,0,0x2b4);
  iVar23 = test_json(&Monster,"{ \"name\": \"Monster\", \"color\": \"Color.Red\"}",
                     "{\"name\":\"Monster\",\"color\":\"Red\"}",0,0,0,0x2b7);
  iVar24 = test_json(&Monster,"{ \"name\": \"Monster\", \"color\": \"MyGame.Example.Color.Red\"}",
                     "{\"name\":\"Monster\",\"color\":\"Red\"}",0,0,0,0x2ba);
  iVar25 = test_json(&Monster,"{ \"name\": \"Monster\", \"hp\": \"Color.Green\"}",
                     "{\"hp\":2,\"name\":\"Monster\"}",0,0,0,0x2bd);
  iVar26 = test_json(&Monster,"{ \"name\": \"Monster\", \"hp\": \"Color.Green\"}",
                     "{\"hp\":2,\"name\":\"Monster\"}",0,0,0,0x2c0);
  iVar27 = test_json(&Monster,
                     "{ \"name\": \"Monster\", \"test_type\": \"Monster\", \"test\": { \"name\": \"any Monster\" } }"
                     ,
                     "{\"name\":\"Monster\",\"test_type\":\"Monster\",\"test\":{\"name\":\"any Monster\"}}"
                     ,0,0,0,0x2c3);
  iVar28 = test_json(&Monster,
                     "{ \"name\": \"Monster\", \"test\": { \"name\": \"second Monster\" }, \"test_type\": \"Monster\"  }"
                     ,
                     "{\"name\":\"Monster\",\"test_type\":\"Monster\",\"test\":{\"name\":\"second Monster\"}}"
                     ,0,0,0,0x2c7);
  iVar29 = test_json(&Monster,
                     "{ \"name\": \"Monster\", \"test\": { \"name\": \"second Monster\" }, \"hp\":17, \"test_type\":\n \"Monster\", \"color\":\"Green\" }"
                     ,
                     "{\"hp\":17,\"name\":\"Monster\",\"color\":\"Green\",\"test_type\":\"Monster\",\"test\":{\"name\":\"second Monster\"}}"
                     ,0,0,0,0x2cb);
  iVar30 = test_json(&Monster,"{ \"name\": \"Monster\", \"test_type\": \"NONE\" }",
                     "{\"name\":\"Monster\"}",0,0,0,0x2cf);
  iVar31 = test_json(&Monster,"{ \"name\": \"Monster\", \"test_type\": 0 }","{\"name\":\"Monster\"}"
                     ,0,0,0,0x2d2);
  iVar32 = test_json(&Monster,
                     "{ \"name\": \"Monster\", \"test\": { \"name\": \"second Monster\", \"color\": \" Red Green \" }, \"test_type\": \"Monster\"  }"
                     ,
                     "{\"name\":\"Monster\",\"test_type\":\"Monster\",\"test\":{\"name\":\"second Monster\",\"color\":\"Red Green\"}}"
                     ,0,0,0,0x315);
  iVar33 = test_json(&Monster,anon_var_dwarf_91c,anon_var_dwarf_933,0,0,0,0x324);
  iVar34 = test_json(&Monster,"{ \"name\": \"\\u168B\\u1691\"}",anon_var_dwarf_955,0,0,0,0x327);
  iVar35 = test_json(&Monster,
                     "{ \"name\": \"Monster\", \"testnestedflatbuffer\":{ \"name\": \"sub Monster\" } }"
                     ,"{\"name\":\"Monster\",\"testnestedflatbuffer\":{\"name\":\"sub Monster\"}}",0
                     ,0,0,0x32b);
  iVar36 = test_json(&Monster,
                     "{ \"name\": \"Monster\", \"testnestedflatbuffer\":[4,0,0,0,248,255,255,255,16,0,0,0,12,0,8,0,0,0,0,0,0,0,4,0,11,0,0,0,115,117,98,32,77,111,110,115,116,101,114,0]}"
                     ,"{\"name\":\"Monster\",\"testnestedflatbuffer\":{\"name\":\"sub Monster\"}}",0
                     ,0,0,0x337);
  iVar37 = test_json(&Monster,"{ \"name\": \"Monster\", \"testempty\": {} }",
                     "{\"name\":\"Monster\",\"testempty\":{}}",0,0,0,0x347);
  iVar38 = test_json(&Monster,"{ \"name\": \"Monster\", \"testarrayoftables\": [] }",
                     "{\"name\":\"Monster\",\"testarrayoftables\":[]}",0,0,0,0x34b);
  iVar39 = test_json(&Monster,
                     "{ \"name\": \"Monster\", \"test_type\":\"Alt\", \"test\":{\"prefix\":{\"testjsonprefixparsing\": { \"aaaa\": \"test\", \"aaaa12345\": 17 } }}}"
                     ,
                     "{\"name\":\"Monster\",\"test_type\":\"Alt\",\"test\":{\"prefix\":{\"testjsonprefixparsing\":{\"aaaa\":\"test\",\"aaaa12345\":17}}}}"
                     ,0,0,0,0x351);
  iVar40 = test_json(&Monster,
                     "{ \"name\": \"Monster\", \"test_type\":\"Alt\", \"test\":{\"prefix\":{\"testjsonprefixparsing\": { \"bbbb\": \"test\", \"bbbb1234\": 19 } }"
                     ,"{\"name\":\"Monster\"}",0,0,0,0x356);
  iVar41 = test_json(&Monster,
                     "{ \"name\": \"Monster\", \"test_type\":\"Alt\", \"test\":{\"prefix\":{\"testjsonprefixparsing\": { \"bbbb\": \"test\", \"bbbb1234\": 19 } }}}"
                     ,
                     "{\"name\":\"Monster\",\"test_type\":\"Alt\",\"test\":{\"prefix\":{\"testjsonprefixparsing\":{\"bbbb\":\"test\",\"bbbb1234\":19}}}}"
                     ,0,0,0,0x35b);
  iVar42 = test_json(&Monster,
                     "{ \"name\": \"Monster\", \"test_type\":\"Alt\", \"test\":{\"prefix\":{\"testjsonprefixparsing\": { \"cccc\": \"test\", \"cccc1234\": 19, \"cccc12345\": 17 } }}}"
                     ,
                     "{\"name\":\"Monster\",\"test_type\":\"Alt\",\"test\":{\"prefix\":{\"testjsonprefixparsing\":{\"cccc\":\"test\",\"cccc1234\":19,\"cccc12345\":17}}}}"
                     ,0,0,0,0x360);
  iVar43 = test_json(&Monster,
                     "{ \"name\": \"Monster\", \"test_type\":\"Alt\", \"test\":{\"prefix\":{\"testjsonprefixparsing\": { \"dddd1234\": 19, \"dddd12345\": 17 } }}}"
                     ,
                     "{\"name\":\"Monster\",\"test_type\":\"Alt\",\"test\":{\"prefix\":{\"testjsonprefixparsing\":{\"dddd1234\":19,\"dddd12345\":17}}}}"
                     ,0,0,0,0x365);
  iVar44 = test_json(&Monster,
                     "{ \"name\": \"Monster\", \"test_type\":\"Alt\", \"test\":{\"prefix\":{\"testjsonprefixparsing2\": { \"aaaa_bbbb_steps\": 19, \"aaaa_bbbb_start_\": 17 } }}}"
                     ,
                     "{\"name\":\"Monster\",\"test_type\":\"Alt\",\"test\":{\"prefix\":{\"testjsonprefixparsing2\":{\"aaaa_bbbb_steps\":19,\"aaaa_bbbb_start_\":17}}}}"
                     ,0,0,0,0x36a);
  iVar45 = test_json(&Monster,
                     "{ \"name\": \"Monster\", \"test_type\":\"Alt\", \"test\":{\"prefix\":{\"testjsonprefixparsing3\": { \"aaaa_bbbb_steps\": 19, \"aaaa_bbbb_start_steps\": 17 } }}}"
                     ,
                     "{\"name\":\"Monster\",\"test_type\":\"Alt\",\"test\":{\"prefix\":{\"testjsonprefixparsing3\":{\"aaaa_bbbb_steps\":19,\"aaaa_bbbb_start_steps\":17}}}}"
                     ,0,0,0,0x36f);
  return -(uint)(iVar45 != 0 ||
                ((iVar44 != 0 || (iVar43 != 0 || (iVar42 != 0 || iVar41 != 0))) ||
                ((iVar40 != 0 ||
                 (iVar39 != 0 ||
                 (iVar38 != 0 ||
                 (iVar37 != 0 || (iVar36 != 0 || (iVar35 != 0 || (iVar34 != 0 || iVar33 != 0)))))))
                || ((iVar32 != 0 ||
                    (iVar31 != 0 ||
                    (iVar30 != 0 || (iVar29 != 0 || (iVar28 != 0 || (iVar27 != 0 || iVar26 != 0)))))
                    ) || ((iVar25 != 0 ||
                          (iVar24 != 0 ||
                          (iVar23 != 0 || (iVar22 != 0 || (iVar21 != 0 || iVar20 != 0))))) ||
                         ((iVar19 != 0 ||
                          (iVar18 != 0 || (iVar17 != 0 || (iVar16 != 0 || iVar15 != 0)))) ||
                         ((iVar14 != 0 || (iVar13 != 0 || (iVar12 != 0 || iVar11 != 0))) ||
                         ((iVar10 != 0 || (iVar9 != 0 || iVar8 != 0)) ||
                         ((iVar7 != 0 || (iVar6 != 0 || iVar5 != 0)) ||
                         ((iVar4 != 0 || iVar3 != 0) || (iVar2 != 0 || iVar1 != 0)))))))))));
}

Assistant:

int main(void)
{
    BEGIN_TEST(Monster);

    ret |= edge_case_tests();
    ret |= error_case_tests();
    ret |= union_vector_tests();
    ret |= fixed_array_tests();
    ret |= base64_tests();
    ret |= mixed_type_union_tests();

    /* Allow trailing comma. */
    TEST(   "{ \"name\": \"Monster\", }",
            "{\"name\":\"Monster\"}");

    TEST(   "{\"color\": \"Red\",  \"name\": \"Monster\", }",
            "{\"name\":\"Monster\",\"color\":\"Red\"}");

    TEST(   "{ \"name\": \"Monster\", \"color\": \"Green\" }",
            "{\"name\":\"Monster\",\"color\":\"Green\"}");

    TEST(   "{ \"name\": \"Monster\", \"color\": \"Green Red Blue\" }",
            "{\"name\":\"Monster\",\"color\":\"Red Green Blue\"}");

    TEST(   "{ \"name\": \"Monster\", \"color\": \"   Green  Red   Blue   \" }",
            "{\"name\":\"Monster\",\"color\":\"Red Green Blue\"}");

    TEST(   "{ \"name\": \"Monster\", \"color\": \"Red\" }",
            "{\"name\":\"Monster\",\"color\":\"Red\"}");

    TEST(   "{ \"name\": \"Monster\", \"color\"  :\"Green\" }",
            "{\"name\":\"Monster\",\"color\":\"Green\"}");

    /* Default value. */
    TEST(   "{ \"name\": \"Monster\", \"color\": \"Blue\" }",
            "{\"name\":\"Monster\"}");

    /* Default value. */
    TEST(   "{ \"name\": \"Monster\", \"color\": 8}",
            "{\"name\":\"Monster\"}");
#if UQ
    /* Allow trailing comma. */
    TEST(   "{ name: \"Monster\", }",
            "{\"name\":\"Monster\"}");

    TEST(   "{color: \"Red\",  name: \"Monster\", }",
            "{\"name\":\"Monster\",\"color\":\"Red\"}");

    TEST(   "{ name: \"Monster\", color: \"Green\" }",
            "{\"name\":\"Monster\",\"color\":\"Green\"}");

    TEST(   "{ name: \"Monster\", color: \"Green Red Blue\" }",
            "{\"name\":\"Monster\",\"color\":\"Red Green Blue\"}");

    TEST(   "{ name: \"Monster\", color: \"   Green  Red   Blue   \" }",
            "{\"name\":\"Monster\",\"color\":\"Red Green Blue\"}");

    TEST(   "{ name: \"Monster\", color: Red }",
            "{\"name\":\"Monster\",\"color\":\"Red\"}");

    TEST(   "{ name: \"Monster\", color: Green }",
            "{\"name\":\"Monster\",\"color\":\"Green\"}");

    /* Default value. */
    TEST(   "{ name: \"Monster\", color: Blue }",
            "{\"name\":\"Monster\"}");

    /* Default value. */
    TEST(   "{ name: \"Monster\", color: 8}",
            "{\"name\":\"Monster\"}");
#endif
#if UQL
    TEST(   "{ name: \"Monster\", color: Green Red }",
            "{\"name\":\"Monster\",\"color\":\"Red Green\"}");
#endif

#if UQL
    /* No leading space in unquoted flag. */
    TEST(   "{ name: \"Monster\", color:Green Red }",
            "{\"name\":\"Monster\",\"color\":\"Red Green\"}");

    TEST(   "{ name: \"Monster\", color: Green Red}",
            "{\"name\":\"Monster\",\"color\":\"Red Green\"}");

    TEST(   "{ name: \"Monster\", color:Green   Blue Red   }",
            "{\"name\":\"Monster\",\"color\":\"Red Green Blue\"}");
#endif

    TEST(   "{ \"name\": \"Monster\", \"color\": 1}",
            "{\"name\":\"Monster\",\"color\":\"Red\"}");

    TEST(   "{ \"name\": \"Monster\", \"color\": 2}",
            "{\"name\":\"Monster\",\"color\":\"Green\"}");

    TEST(   "{ \"name\": \"Monster\", \"color\": 9}",
            "{\"name\":\"Monster\",\"color\":\"Red Blue\"}");

    TEST(   "{ \"name\": \"Monster\", \"color\": 11}",
            "{\"name\":\"Monster\",\"color\":\"Red Green Blue\"}");

    TEST(   "{ \"name\": \"Monster\", \"color\": 12}",
            "{\"name\":\"Monster\",\"color\":12}");

    TEST(   "{ \"name\": \"Monster\", \"color\": 15}",
            "{\"name\":\"Monster\",\"color\":15}");

    TEST(   "{ \"name\": \"Monster\", \"color\": 0}",
            "{\"name\":\"Monster\",\"color\":0}");

    TEST(   "{ \"name\": \"Monster\", \"color\": \"Color.Red\"}",
            "{\"name\":\"Monster\",\"color\":\"Red\"}");

    TEST(   "{ \"name\": \"Monster\", \"color\": \"MyGame.Example.Color.Red\"}",
            "{\"name\":\"Monster\",\"color\":\"Red\"}");

    TEST(   "{ \"name\": \"Monster\", \"hp\": \"Color.Green\"}",
            "{\"hp\":2,\"name\":\"Monster\"}");

    TEST(   "{ \"name\": \"Monster\", \"hp\": \"Color.Green\"}",
            "{\"hp\":2,\"name\":\"Monster\"}");

    TEST(   "{ \"name\": \"Monster\", \"test_type\": \"Monster\", \"test\": { \"name\": \"any Monster\" } }",
            "{\"name\":\"Monster\",\"test_type\":\"Monster\",\"test\":{\"name\":\"any Monster\"}}");

    /* This is tricky because the test field must be reparsed after discovering the test type. */
    TEST(   "{ \"name\": \"Monster\", \"test\": { \"name\": \"second Monster\" }, \"test_type\": \"Monster\"  }",
            "{\"name\":\"Monster\",\"test_type\":\"Monster\",\"test\":{\"name\":\"second Monster\"}}");

    /* Also test that parsing can continue after reparse. */
    TEST(   "{ \"name\": \"Monster\", \"test\": { \"name\": \"second Monster\" }, \"hp\":17, \"test_type\":\n \"Monster\", \"color\":\"Green\" }",
            "{\"hp\":17,\"name\":\"Monster\",\"color\":\"Green\",\"test_type\":\"Monster\",\"test\":{\"name\":\"second Monster\"}}");

    /* Test that NONE is recognized, and that we do not get a missing table error.*/
    TEST(   "{ \"name\": \"Monster\", \"test_type\": \"NONE\" }",
            "{\"name\":\"Monster\"}");

    TEST(   "{ \"name\": \"Monster\", \"test_type\": 0 }",
            "{\"name\":\"Monster\"}");

#if UQ
    TEST(   "{ name: \"Monster\", color: 1}",
            "{\"name\":\"Monster\",\"color\":\"Red\"}");

    TEST(   "{ name: \"Monster\", color: 2}",
            "{\"name\":\"Monster\",\"color\":\"Green\"}");

    TEST(   "{ name: \"Monster\", color: 9}",
            "{\"name\":\"Monster\",\"color\":\"Red Blue\"}");

    TEST(   "{ name: \"Monster\", color: 11}",
            "{\"name\":\"Monster\",\"color\":\"Red Green Blue\"}");

    TEST(   "{ name: \"Monster\", color: 12}",
            "{\"name\":\"Monster\",\"color\":12}");

    TEST(   "{ name: \"Monster\", color: 15}",
            "{\"name\":\"Monster\",\"color\":15}");

    TEST(   "{ name: \"Monster\", color: 0}",
            "{\"name\":\"Monster\",\"color\":0}");

    TEST(   "{ name: \"Monster\", color: Color.Red}",
            "{\"name\":\"Monster\",\"color\":\"Red\"}");

    TEST(   "{ name: \"Monster\", color: MyGame.Example.Color.Red}",
            "{\"name\":\"Monster\",\"color\":\"Red\"}");

    TEST(   "{ name: \"Monster\", hp: Color.Green}",
            "{\"hp\":2,\"name\":\"Monster\"}");

    TEST(   "{ name: \"Monster\", hp: Color.Green}",
            "{\"hp\":2,\"name\":\"Monster\"}");

    TEST(   "{ name: \"Monster\", test_type: Monster, test: { name: \"any Monster\" } }",
            "{\"name\":\"Monster\",\"test_type\":\"Monster\",\"test\":{\"name\":\"any Monster\"}}");

    /* This is tricky because the test field must be reparsed after discovering the test type. */
    TEST(   "{ name: \"Monster\", test: { name: \"second Monster\" }, test_type: Monster  }",
            "{\"name\":\"Monster\",\"test_type\":\"Monster\",\"test\":{\"name\":\"second Monster\"}}");

    /* Also test that parsing can continue after reparse. */
    TEST(   "{ name: \"Monster\", test: { name: \"second Monster\" }, hp:17, test_type:\n Monster, color:Green }",
            "{\"hp\":17,\"name\":\"Monster\",\"color\":\"Green\",\"test_type\":\"Monster\",\"test\":{\"name\":\"second Monster\"}}");

    /* Test that NONE is recognized, and that we do not get a missing table error.*/
    TEST(   "{ name: \"Monster\", test_type: NONE }",
            "{\"name\":\"Monster\"}");

    TEST(   "{ name: \"Monster\", test_type: 0 }",
            "{\"name\":\"Monster\"}");

#endif

#if UQL
    /*
     * Test that generic parsing handles multiple flags correctly during
     * first pass before backtracking.
     */
    TEST(   "{ name: \"Monster\", test: { name: \"second Monster\", color: Red Green }, test_type: Monster  }",
            "{\"name\":\"Monster\",\"test_type\":\"Monster\",\"test\":{\"name\":\"second Monster\",\"color\":\"Red Green\"}}");
#endif

    /* Ditto quoted flags. */
    TEST(   "{ \"name\": \"Monster\", \"test\": { \"name\": \"second Monster\", \"color\": \" Red Green \" }, \"test_type\": \"Monster\"  }",
            "{\"name\":\"Monster\",\"test_type\":\"Monster\",\"test\":{\"name\":\"second Monster\",\"color\":\"Red Green\"}}");

    /*
     * Note the '\/' becomes just '/', and that '/' also works in input.
     *
     * The json printer does not have a concept of \x it always uses
     * unicode.
     *
     * We use json extension \x to inject a control 03 which extends
     * to a printed unicode escape, while the \u00F8 is a valid
     * character after encoding, and is thus not escaped after printing
     * but rather becoems a two-byte utf-8 encoding of 'ø' which
     * we use C encoding to form utf8 C3B8 == \u00F8.
     */
    TEST(   "{ \"name\": \"Mon\xfF\xFf\\x03s\\xC3\\xF9\\u00F8ter\\b\\f\\n\\r\\t\\\"\\\\\\/'/\", }",
            "{\"name\":\"Mon\xff\xff\\u0003s\xc3\xf9\xc3\xb8ter\\b\\f\\n\\r\\t\\\"\\\\/'/\"}");

    TEST(   "{ \"name\": \"\\u168B\\u1691\"}",
            "{\"name\":\"\xe1\x9a\x8b\xe1\x9a\x91\"}");

    /* Nested flatbuffer, either is a known object, or as a vector. */
    TEST(   "{ \"name\": \"Monster\", \"testnestedflatbuffer\":{ \"name\": \"sub Monster\" } }",
            "{\"name\":\"Monster\",\"testnestedflatbuffer\":{\"name\":\"sub Monster\"}}");

#if FLATBUFFERS_PROTOCOL_IS_LE
    TEST(   "{ \"name\": \"Monster\", \"testnestedflatbuffer\":"
            "[" /* start of nested flatbuffer, implicit size: 40 */
            "4,0,0,0," /* header: object offset = 4, no identifier */
            "248,255,255,255," /* vtable offset */
            "16,0,0,0," /* offset to name */
            "12,0,8,0,0,0,0,0,0,0,4,0," /* vtable */
            "11,0,0,0,115,117,98,32,77,111,110,115,116,101,114,0" /* name = "sub Monster" */
            "]" /* end of nested flatbuffer */
            "}",
            "{\"name\":\"Monster\",\"testnestedflatbuffer\":{\"name\":\"sub Monster\"}}");
#else
    TEST(   "{ \"name\": \"Monster\", \"testnestedflatbuffer\":"
            "[" /* start of nested flatbuffer, implicit size: 40 */
            "0,0,0,4," /* header: object offset = 4, no identifier */
            "255,255,255,248," /* vtable offset */
            "0,0,0,16," /* offset to name */
            "0,12,0,8,0,0,0,0,0,0,0,4," /* vtable */
            "0,0,0,11,115,117,98,32,77,111,110,115,116,101,114,0" /* name = "sub Monster" */
            "]" /* end of nested flatbuffer */
            "}",
            "{\"name\":\"Monster\",\"testnestedflatbuffer\":{\"name\":\"sub Monster\"}}");
#endif

    /* Test empty table */
    TEST(   "{ \"name\": \"Monster\", \"testempty\": {} }",
            "{\"name\":\"Monster\",\"testempty\":{}}");

    /* Test empty array */
    TEST(   "{ \"name\": \"Monster\", \"testarrayoftables\": [] }",
            "{\"name\":\"Monster\",\"testarrayoftables\":[]}");

    /* Test JSON prefix parsing */
    TEST(   "{ \"name\": \"Monster\", \"test_type\":\"Alt\", \"test\":{\"prefix\":{"
            "\"testjsonprefixparsing\": { \"aaaa\": \"test\", \"aaaa12345\": 17 } }}}",
            "{\"name\":\"Monster\",\"test_type\":\"Alt\",\"test\":{\"prefix\":{"
            "\"testjsonprefixparsing\":{\"aaaa\":\"test\",\"aaaa12345\":17}}}}");

    /* TODO: this parses with the last to }} missing, although it does not add the broken objects. */
    TEST(   "{ \"name\": \"Monster\", \"test_type\":\"Alt\", \"test\":{\"prefix\":{"
            "\"testjsonprefixparsing\": { \"bbbb\": \"test\", \"bbbb1234\": 19 } }",
            "{\"name\":\"Monster\"}");

    TEST(   "{ \"name\": \"Monster\", \"test_type\":\"Alt\", \"test\":{\"prefix\":{"
            "\"testjsonprefixparsing\": { \"bbbb\": \"test\", \"bbbb1234\": 19 } }}}",
            "{\"name\":\"Monster\",\"test_type\":\"Alt\",\"test\":{\"prefix\":{"
            "\"testjsonprefixparsing\":{\"bbbb\":\"test\",\"bbbb1234\":19}}}}");

    TEST(   "{ \"name\": \"Monster\", \"test_type\":\"Alt\", \"test\":{\"prefix\":{"
            "\"testjsonprefixparsing\": { \"cccc\": \"test\", \"cccc1234\": 19, \"cccc12345\": 17 } }}}",
            "{\"name\":\"Monster\",\"test_type\":\"Alt\",\"test\":{\"prefix\":{"
            "\"testjsonprefixparsing\":{\"cccc\":\"test\",\"cccc1234\":19,\"cccc12345\":17}}}}");

    TEST(   "{ \"name\": \"Monster\", \"test_type\":\"Alt\", \"test\":{\"prefix\":{"
            "\"testjsonprefixparsing\": { \"dddd1234\": 19, \"dddd12345\": 17 } }}}",
            "{\"name\":\"Monster\",\"test_type\":\"Alt\",\"test\":{\"prefix\":{"
            "\"testjsonprefixparsing\":{\"dddd1234\":19,\"dddd12345\":17}}}}");

    TEST(   "{ \"name\": \"Monster\", \"test_type\":\"Alt\", \"test\":{\"prefix\":{"
            "\"testjsonprefixparsing2\": { \"aaaa_bbbb_steps\": 19, \"aaaa_bbbb_start_\": 17 } }}}",
            "{\"name\":\"Monster\",\"test_type\":\"Alt\",\"test\":{\"prefix\":{"
            "\"testjsonprefixparsing2\":{\"aaaa_bbbb_steps\":19,\"aaaa_bbbb_start_\":17}}}}");

    TEST(   "{ \"name\": \"Monster\", \"test_type\":\"Alt\", \"test\":{\"prefix\":{"
            "\"testjsonprefixparsing3\": { \"aaaa_bbbb_steps\": 19, \"aaaa_bbbb_start_steps\": 17 } }}}",
            "{\"name\":\"Monster\",\"test_type\":\"Alt\",\"test\":{\"prefix\":{"
            "\"testjsonprefixparsing3\":{\"aaaa_bbbb_steps\":19,\"aaaa_bbbb_start_steps\":17}}}}");

    return ret ? -1: 0;
}